

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O3

char replay_query_key(char *query,int *count)

{
  int iVar1;
  char *pcVar2;
  int cnt;
  int key;
  char local_c [4];
  
  pcVar2 = next_log_token();
  iVar1 = __isoc99_sscanf(pcVar2,"k:%x:%x",local_c);
  if (0 < iVar1) {
    if (count != (int *)0x0) {
      *count = -1;
    }
    return local_c[0];
  }
  parse_error("Bad query_key data");
}

Assistant:

static char replay_query_key(const char *query, int *count)
{
    int key;
    char *token = next_log_token();
    int cnt = -1, n;
    
    n = sscanf(token, "k:%x:%x", &key, &cnt);
    if (n < 1)
	parse_error("Bad query_key data");
    
    if (count)
	*count = cnt;

    return key;
}